

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe_tests.cc
# Opt level: O0

bool lf::uscalfe::test::scalarFEEvalNodeTest<double>(ScalarReferenceFiniteElement<double> *fe_desc)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  RealScalar val1;
  Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> PVar4
  ;
  AssertHelper local_140;
  Message local_138;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
  local_130;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_2;
  Matrix<double,_1,__1,_1,_1,__1> coeffs;
  undefined1 local_e8 [8];
  RowVectorXd nodvals;
  undefined1 local_c0 [8];
  RowVectorXd rand_coeffs;
  Message local_a8;
  Index local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Matrix<double,__1,__1,_0,__1,__1> rsf_at_evln;
  size_type N_rsf;
  Message local_60;
  Index local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  uint local_2c;
  undefined1 local_28 [4];
  size_type N_evln;
  MatrixXd evl_nodes;
  ScalarReferenceFiniteElement<double> *fe_desc_local;
  
  evl_nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)fe_desc;
  (*fe_desc->_vptr_ScalarReferenceFiniteElement[9])(local_28);
  local_2c = (**(code **)(*(long *)evl_nodes.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_cols + 0x50))();
  local_58 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_28);
  testing::internal::EqHelper::Compare<long,_unsigned_int,_nullptr>
            ((EqHelper *)local_50,"evl_nodes.cols()","N_evln",&local_58,&local_2c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pMVar2 = testing::Message::operator<<(&local_60,(char (*) [23])"No. evl nodes mismatch");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff98,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  rsf_at_evln.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
  _4_4_ = (**(code **)(*(long *)evl_nodes.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols + 0x20))();
  (**(code **)(*(long *)evl_nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols + 0x38))
            (&gtest_ar_1.message_,
             evl_nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols,local_28);
  local_a0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                       ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        &gtest_ar_1.message_);
  testing::internal::EqHelper::Compare<long,_unsigned_int,_nullptr>
            ((EqHelper *)local_98,"rsf_at_evln.rows()","N_rsf",&local_a0,
             (uint *)((long)&rsf_at_evln.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_cols + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pMVar2 = testing::Message::operator<<(&local_a8,(char (*) [17])"No. rsf mismatch");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &rand_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_cols,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x2a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &rand_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_cols,pMVar2);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &rand_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                .m_cols);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::Random
            ((RandomReturnType *)
             &nodvals.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols,(ulong)rsf_at_evln.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols._4_4_);
  Eigen::Matrix<double,1,-1,1,1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>>>
            ((Matrix<double,1,_1,1,1,_1> *)local_c0,
             (CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>
              *)&nodvals.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                 m_cols);
  PVar4 = Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator*
                    ((MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)local_c0,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&gtest_ar_1.message_);
  coeffs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
       (Index)PVar4.m_lhs;
  Eigen::Matrix<double,1,-1,1,1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((Matrix<double,1,_1,1,1,_1> *)local_e8,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&coeffs.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
                 m_cols);
  (**(code **)(*(long *)evl_nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols + 0x58))
            (&gtest_ar_2.message_,
             evl_nodes.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_cols,local_e8);
  Eigen::MatrixBase<Eigen::Matrix<double,1,-1,1,1,-1>>::operator-
            (&local_130,(MatrixBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&gtest_ar_2.message_,
             (MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_c0);
  val1 = Eigen::
         MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
         ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                 *)&local_130);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_118,"(coeffs - rand_coeffs).norm()","0.0","1e-13",val1,0.0,1e-13);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pMVar2 = testing::Message::operator<<(&local_138,(char (*) [21])"Coefficient mismatch");
    pMVar2 = testing::Message::operator<<
                       (pMVar2,(Matrix<double,_1,__1,_1,_1,__1> *)&gtest_ar_2.message_);
    pMVar2 = testing::Message::operator<<(pMVar2,(char (*) [6])" <-> ");
    pMVar2 = testing::Message::operator<<(pMVar2,(Matrix<double,_1,__1,_1,_1,__1> *)local_c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/lagr_fe_tests.cc"
               ,0x35,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix
            ((Matrix<double,_1,__1,_1,_1,__1> *)&gtest_ar_2.message_);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_e8);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_c0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)&gtest_ar_1.message_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_28);
  return true;
}

Assistant:

bool scalarFEEvalNodeTest(
    const lf::fe::ScalarReferenceFiniteElement<SCALAR> &fe_desc) {
  // Evaluates a random linear combination of reference shape functions
  // at the evaluation nodes for the finite element and then reconstructs
  // the "interpolant" which must agree with what we started from

  // Fetch evaluation nodes
  const Eigen::MatrixXd evl_nodes{fe_desc.EvaluationNodes()};
  const size_type N_evln = fe_desc.NumEvaluationNodes();
  EXPECT_EQ(evl_nodes.cols(), N_evln) << "No. evl nodes mismatch";

  // Evaluate reference shape functions in evaluation nodes
  const size_type N_rsf = fe_desc.NumRefShapeFunctions();
  auto rsf_at_evln = fe_desc.EvalReferenceShapeFunctions(evl_nodes);
  EXPECT_EQ(rsf_at_evln.rows(), N_rsf) << "No. rsf mismatch";

  // Form random linear combination and store it values
  // in the evaluation nodes
  Eigen::RowVectorXd rand_coeffs{Eigen::RowVectorXd::Random(N_rsf)};
  Eigen::RowVectorXd nodvals = rand_coeffs * rsf_at_evln;

  // Reconstruct linear combination
  Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> coeffs{
      fe_desc.NodalValuesToDofs(nodvals)};
  // Check agreement of coefficients
  EXPECT_NEAR((coeffs - rand_coeffs).norm(), 0.0, 1e-13)
      << "Coefficient mismatch" << coeffs << " <-> " << rand_coeffs;
  return true;
}